

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::HighbdDrPredTest_DISABLED_Speed_Test::
~HighbdDrPredTest_DISABLED_Speed_Test(HighbdDrPredTest_DISABLED_Speed_Test *this)

{
  void *in_RDI;
  
  ~HighbdDrPredTest_DISABLED_Speed_Test((HighbdDrPredTest_DISABLED_Speed_Test *)0x516b18);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, DISABLED_Speed) {
  const int angles[] = { 3, 45, 87 };
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int i = 0; i < 3; ++i) {
      int angle = angles[i] + start_angle_;
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
             enable_upsample_, angle);
      if (dx_ && dy_) RunTest(true, false, angle);
    }
  }
}